

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

string * __thiscall
Catch::Config::getProcessName_abi_cxx11_(string *__return_storage_ptr__,Config *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->m_data).processName);
  return __return_storage_ptr__;
}

Assistant:

std::string Config::getProcessName() const { return m_data.processName; }